

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall
SummizerTestGlobal6_CanSumGlobal6_Test::TestBody(SummizerTestGlobal6_CanSumGlobal6_Test *this)

{
  bool bVar1;
  int iVar2;
  pointer pgVar3;
  gmock_globalmock_sum6 *this_00;
  type this_01;
  MockSpec<int_(int,_int,_int,_int,_int,_int)> *this_02;
  TypedExpectation<int_(int,_int,_int,_int,_int,_int)> *this_03;
  WithoutMatchers local_151;
  Matcher<int> local_150;
  Matcher<int> local_138;
  Matcher<int> local_120;
  Matcher<int> local_108;
  Matcher<int> local_f0;
  Matcher<int> local_d8;
  MockSpec<int_(int,_int,_int,_int,_int,_int)> local_c0;
  GlobalMockDeleter<gmock_globalmock_sum6> local_18;
  GlobalMockDeleter<gmock_globalmock_sum6> mock_deleter7;
  SummizerTestGlobal6_CanSumGlobal6_Test *this_local;
  
  mock_deleter7.m_mockReference =
       (unique_ptr<gmock_globalmock_sum6,_std::default_delete<gmock_globalmock_sum6>_> *)this;
  GlobalMockDeleter<gmock_globalmock_sum6>::GlobalMockDeleter
            (&local_18,&gmock_globalmock_sum6_instance);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&gmock_globalmock_sum6_instance);
  if (bVar1) {
    pgVar3 = std::unique_ptr<gmock_globalmock_sum6,_std::default_delete<gmock_globalmock_sum6>_>::
             operator->(&gmock_globalmock_sum6_instance);
    iVar2 = strcmp(pgVar3->m_tag,"TestBody");
    if (iVar2 == 0) goto LAB_00114134;
  }
  this_00 = (gmock_globalmock_sum6 *)operator_new(0x50);
  gmock_globalmock_sum6::gmock_globalmock_sum6(this_00,"TestBody");
  std::unique_ptr<gmock_globalmock_sum6,_std::default_delete<gmock_globalmock_sum6>_>::reset
            (&gmock_globalmock_sum6_instance,this_00);
LAB_00114134:
  this_01 = std::unique_ptr<gmock_globalmock_sum6,_std::default_delete<gmock_globalmock_sum6>_>::
            operator*(&gmock_globalmock_sum6_instance);
  testing::Matcher<int>::Matcher(&local_d8,1);
  testing::Matcher<int>::Matcher(&local_f0,2);
  testing::Matcher<int>::Matcher(&local_108,3);
  testing::Matcher<int>::Matcher(&local_120,4);
  testing::Matcher<int>::Matcher(&local_138,5);
  testing::Matcher<int>::Matcher(&local_150,6);
  gmock_globalmock_sum6::gmock_sum6
            (&local_c0,this_01,&local_d8,&local_f0,&local_108,&local_120,&local_138,&local_150);
  testing::internal::GetWithoutMatchers();
  this_02 = testing::internal::MockSpec<int_(int,_int,_int,_int,_int,_int)>::operator()
                      (&local_c0,&local_151,(void *)0x0);
  this_03 = testing::internal::MockSpec<int_(int,_int,_int,_int,_int,_int)>::InternalExpectedAt
                      (this_02,
                       "/workspace/llm4binary/github/license_c_cmakelists/apriorit[P]gmock-global/sample/main.cpp"
                       ,0x78,"*gmock_globalmock_sum6_instance","sum6(1, 2, 3, 4, 5, 6)");
  testing::internal::TypedExpectation<int_(int,_int,_int,_int,_int,_int)>::Times(this_03,1);
  testing::internal::MockSpec<int_(int,_int,_int,_int,_int,_int)>::~MockSpec(&local_c0);
  testing::Matcher<int>::~Matcher(&local_150);
  testing::Matcher<int>::~Matcher(&local_138);
  testing::Matcher<int>::~Matcher(&local_120);
  testing::Matcher<int>::~Matcher(&local_108);
  testing::Matcher<int>::~Matcher(&local_f0);
  testing::Matcher<int>::~Matcher(&local_d8);
  sum6(1,2,3,4,5,6);
  GlobalMockDeleter<gmock_globalmock_sum6>::~GlobalMockDeleter(&local_18);
  return;
}

Assistant:

TEST(SummizerTestGlobal6, CanSumGlobal6)
{
    EXPECT_GLOBAL_CALL(sum6, sum6(1, 2, 3, 4, 5, 6)).Times(1);
    sum6(1, 2, 3, 4, 5, 6);
}